

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

void __thiscall nuraft::snapshot_io_mgr::~snapshot_io_mgr(snapshot_io_mgr *this)

{
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ::_M_clear(&(this->queue_).
              super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->io_thread_ea_).
              super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::thread::~thread(&this->io_thread_);
  return;
}

Assistant:

snapshot_io_mgr::~snapshot_io_mgr() {
    shutdown();
}